

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

GPU_RendererID *
GPU_MakeRendererID(GPU_RendererID *__return_storage_ptr__,char *name,GPU_RendererEnum renderer,
                  int major_version,int minor_version)

{
  __return_storage_ptr__->name = name;
  __return_storage_ptr__->renderer = renderer;
  __return_storage_ptr__->major_version = major_version;
  __return_storage_ptr__->minor_version = minor_version;
  return __return_storage_ptr__;
}

Assistant:

GPU_RendererID GPU_MakeRendererID(const char* name, GPU_RendererEnum renderer, int major_version, int minor_version)
{
    GPU_RendererID r;
    r.name = name;
    r.renderer = renderer;
    r.major_version = major_version;
    r.minor_version = minor_version;

    return r;
}